

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O1

void __thiscall
duckdb::WindowHashGroup::WindowHashGroup
          (WindowHashGroup *this,WindowGlobalSinkState *gstate,idx_t hash_bin_p)

{
  unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>,_true> *puVar1;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var3;
  ulong uVar4;
  __pthread_internal_list *p_Var5;
  BoundWindowExpression *pBVar6;
  _Hash_node_base *p_Var7;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> _Var8;
  _Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __ptr_00;
  WindowCollection *__ptr_01;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pLVar11;
  reference pvVar12;
  pointer pPVar13;
  atomic<unsigned_long> *paVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  unsigned_long uVar16;
  pointer pWVar17;
  mapped_type *pmVar18;
  pointer pRVar19;
  type swizzled_block_collection;
  type swizzled_string_heap;
  type block_collection;
  type string_heap;
  pointer pGVar20;
  BufferManager *buffer_manager;
  WindowCollection *this_01;
  pointer *__ptr_3;
  pointer *__ptr;
  unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true> *wexec;
  __pthread_internal_list *this_02;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_03;
  buffer_ptr<ValidityBuffer> *pbVar21;
  optional_ptr<const_duckdb::Expression,_true> *expr;
  ulong uVar22;
  pointer this_04;
  pointer __p;
  vector<duckdb::LogicalType,_true> types;
  OrderMasks *__range2;
  undefined1 local_d8 [64];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98 [2];
  undefined8 local_68;
  undefined8 local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  WindowCollection *local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_68 = &this->layout;
  this->blocks = 0;
  (this->rows).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->hash_group).
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
       (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)0x0;
  this->count = 0;
  (this->heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  RowLayout::RowLayout((RowLayout *)local_68);
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->order_masks;
  (this->order_masks)._M_h._M_buckets = &(this->order_masks)._M_h._M_single_bucket;
  (this->order_masks)._M_h._M_bucket_count = 1;
  (this->order_masks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->order_masks)._M_h._M_element_count = 0;
  (this->order_masks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  puVar1 = &this->collection;
  (this->stage)._M_i = SINK;
  (this->order_masks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->order_masks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->collection).
  super_unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
  .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl = (WindowCollection *)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hash_bin = hash_bin_p;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->next_task = 0;
  (this->sunk).super___atomic_base<unsigned_long>._M_i = 0;
  (this->finalized).super___atomic_base<unsigned_long>._M_i = 0;
  (this->completed).super___atomic_base<unsigned_long>._M_i = 0;
  this->batch_base = 0;
  local_60 = gstate;
  local_d8._48_8_ =
       unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
       ::operator*(&gstate->global_partition);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &(((type)local_d8._48_8_)->super_PartitionGlobalSinkState).payload_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize((RowLayout *)local_68,(vector<duckdb::LogicalType,_true> *)&local_48,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_98[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)&((PartitionGlobalSinkState *)local_d8._48_8_)->hash_groups;
  if ((this->hash_bin <
       (ulong)((long)(((PartitionGlobalSinkState *)local_d8._48_8_)->hash_groups).
                     super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(((PartitionGlobalSinkState *)local_d8._48_8_)->hash_groups).
                     super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
     (pvVar12 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                              *)local_98[1].
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish,this->hash_bin),
     (pvVar12->
     super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
     )._M_t.
     super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
     .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
     (PartitionGlobalHashGroup *)0x0)) {
    pvVar12 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                            *)local_98[1].
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish,this->hash_bin);
    pPVar13 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
              ::operator->(pvVar12);
    paVar14 = &pPVar13->count;
  }
  else {
    if ((((PartitionGlobalSinkState *)local_d8._48_8_)->rows).
        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
        (RowDataCollection *)0x0) {
      return;
    }
    if (this->hash_bin != 0) {
      return;
    }
    paVar14 = &((PartitionGlobalSinkState *)local_d8._48_8_)->count;
  }
  local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(paVar14->super___atomic_base<unsigned_long>)._M_i;
  this->count = (idx_t)local_98[0].
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity =
       (idx_t)local_98[0].
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
            ((duckdb *)local_d8,(unsigned_long *)local_98);
  uVar10 = local_d8._8_8_;
  uVar9 = local_d8._0_8_;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  p_Var2 = (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar9;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pbVar21 = &(this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data;
  if ((pointer)local_d8._8_8_ != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar21);
  local_98[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->partition_mask;
  _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (pTVar15->owned_data).
       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  uVar4 = this->count;
  if (_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl == (unsigned_long *)0x0) {
    local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)local_d8,(unsigned_long *)local_98);
    uVar10 = local_d8._8_8_;
    uVar9 = local_d8._0_8_;
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    p_Var2 = (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.
             internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar9;
    (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar21);
    *(unsigned_long **)
     local_98[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pTVar15->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  pLVar11 = local_98[1].
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_d8._56_8_ = puVar1;
  if (uVar4 != 0) {
    uVar22 = uVar4 + 0x3f >> 6;
    if (uVar22 != 1) {
      switchD_0105b559::default
                (*(unsigned_long **)
                  local_98[1].
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,uVar22 * 8 - 8);
    }
    uVar16 = -1L << ((byte)uVar4 & 0x3f);
    if ((uVar4 & 0x3f) == 0) {
      uVar16 = 0;
    }
    (*(unsigned_long **)pLVar11)[uVar22 - 1] = uVar16;
  }
  p_Var5 = ((__pthread_internal_list *)(local_60 + 0x70))->__next;
  local_d8._32_8_ = &this->rows;
  local_d8._40_8_ = &this->heap;
  for (this_02 = (__pthread_internal_list *)
                 (((vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                    *)&((__pthread_internal_list *)(local_60 + 0x70))->__prev)->
                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pLVar11 = local_98[1].
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage, uVar9 = local_d8._32_8_,
      this_02 != p_Var5; this_02 = (__pthread_internal_list *)&this_02->__next) {
    pWVar17 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
              ::operator->((unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                            *)this_02);
    pBVar6 = pWVar17->wexpr;
    local_d8._0_8_ =
         ((long)(pBVar6->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar6->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)(pBVar6->partitions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar6->partitions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    pmVar18 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_58,(key_type *)local_d8);
    if ((pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
    {
      local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this->count;
      (pmVar18->super_TemplatedValidityMask<unsigned_long>).capacity =
           (idx_t)local_98[0].
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_d8,(unsigned_long *)local_98);
      uVar10 = local_d8._8_8_;
      uVar9 = local_d8._0_8_;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      p_Var2 = (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar9;
      (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((pointer)local_d8._8_8_ != (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      pbVar21 = &(pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data;
      pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar21);
      _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (pTVar15->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      uVar4 = this->count;
      if (_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl == (unsigned_long *)0x0)
      {
        local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(pmVar18->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_d8,(unsigned_long *)local_98);
        uVar10 = local_d8._8_8_;
        uVar9 = local_d8._0_8_;
        local_d8._0_8_ = (pointer)0x0;
        local_d8._8_8_ = (pointer)0x0;
        p_Var2 = (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)uVar9;
        (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((pointer)local_d8._8_8_ != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (pbVar21);
        (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar15->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      if (uVar4 != 0) {
        uVar22 = uVar4 + 0x3f >> 6;
        if (uVar22 != 1) {
          switchD_0105b559::default
                    ((pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask,0,
                     uVar22 * 8 - 8);
        }
        uVar16 = -1L << ((byte)uVar4 & 0x3f);
        if ((uVar4 & 0x3f) == 0) {
          uVar16 = 0;
        }
        (pmVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar22 - 1] = uVar16;
      }
    }
  }
  this->external = ((PartitionGlobalSinkState *)local_d8._48_8_)->external;
  uVar4 = this->hash_bin;
  if ((((PartitionGlobalSinkState *)local_d8._48_8_)->rows).
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
      (RowDataCollection *)0x0 || uVar4 != 0) {
    if (uVar4 < (ulong)((long)(((PartitionGlobalSinkState *)local_d8._48_8_)->hash_groups).
                              super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(((PartitionGlobalSinkState *)local_d8._48_8_)->hash_groups).
                              super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar12 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                              *)local_98[1].
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish,uVar4);
      _Var8._M_head_impl =
           (pvVar12->
           super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
      (pvVar12->
      super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
           (PartitionGlobalHashGroup *)0x0;
      __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
           (this->hash_group).
           super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>;
      (this->hash_group).
      super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
           (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)_Var8._M_head_impl;
      if (__ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
          (PartitionGlobalHashGroup *)0x0) {
        ::std::default_delete<duckdb::PartitionGlobalHashGroup>::operator()
                  ((default_delete<duckdb::PartitionGlobalHashGroup> *)this,
                   (PartitionGlobalHashGroup *)
                   __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>.
                   _M_head_impl);
      }
      pPVar13 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                ::operator->(&this->hash_group);
      PartitionGlobalHashGroup::ComputeMasks(pPVar13,(ValidityMask *)pLVar11,(OrderMasks *)local_58)
      ;
      pPVar13 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                ::operator->(&this->hash_group);
      pGVar20 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&pPVar13->global_sort);
      this->external = pGVar20->external;
      MaterializeSortedData(this);
    }
  }
  else {
    **(ulong **)
      local_98[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
         **(ulong **)
           local_98[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage | 1;
    this_00 = &((PartitionGlobalSinkState *)local_d8._48_8_)->rows;
    for (p_Var7 = (this->order_masks)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
        p_Var7 = p_Var7->_M_nxt) {
      (p_Var7[2]._M_nxt)->_M_nxt = (_Hash_node_base *)((ulong)(p_Var7[2]._M_nxt)->_M_nxt | 1);
    }
    pRVar19 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_00);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_00);
    RowDataCollection::CloneEmpty((RowDataCollection *)local_d8,SUB81(pRVar19,0));
    uVar10 = local_d8._0_8_;
    local_d8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)uVar9,(pointer)uVar10);
    uVar10 = local_d8._0_8_;
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 (local_d8._0_8_ + 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)(uVar10 + 0x20));
      operator_delete((void *)uVar10);
    }
    this_03 = &((PartitionGlobalSinkState *)local_d8._48_8_)->strings;
    pRVar19 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_03);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_03);
    RowDataCollection::CloneEmpty((RowDataCollection *)local_d8,SUB81(pRVar19,0));
    uVar10 = local_d8._0_8_;
    local_d8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)local_d8._40_8_,(pointer)uVar10);
    uVar10 = local_d8._0_8_;
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 (local_d8._0_8_ + 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)(uVar10 + 0x20));
      operator_delete((void *)uVar10);
    }
    swizzled_block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                      *)uVar9);
    swizzled_string_heap =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                      *)local_d8._40_8_);
    block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(this_00);
    string_heap = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator*(this_03);
    RowDataCollectionScanner::AlignHeapBlocks
              (swizzled_block_collection,swizzled_string_heap,block_collection,string_heap,
               (RowLayout *)local_68);
    this->external = true;
  }
  if ((((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_> *)
       uVar9)->_M_t).
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (RowDataCollection *)0x0) {
    pRVar19 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                            *)uVar9);
    this->blocks = (long)(pRVar19->blocks).
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pRVar19->blocks).
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  WindowSharedExpressions::GetSortedExpressions
            ((vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)local_d8,
             (Shared *)&((__pthread_internal_list *)(local_60 + 0x80))->__next);
  uVar9 = local_d8._8_8_;
  local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_d8._0_8_ != local_d8._8_8_) {
    this_04 = (pointer)local_d8._0_8_;
    do {
      optional_ptr<const_duckdb::Expression,_true>::CheckValid
                ((optional_ptr<const_duckdb::Expression,_true> *)this_04);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)local_98,
                 (LogicalType *)
                 ((long)(((unsafe_unique_array<unsigned_long> *)&this_04->buffer_manager)->
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>).
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t + 0x38));
      this_04 = (pointer)&this_04->count;
    } while (this_04 != (pointer)uVar9);
  }
  buffer_manager =
       BufferManager::GetBufferManager
                 ((ClientContext *)((__pthread_internal_list *)(local_60 + 0x60))->__prev);
  this_01 = (WindowCollection *)operator_new(0xb8);
  WindowCollection::WindowCollection
            (this_01,buffer_manager,this->count,(vector<duckdb::LogicalType,_true> *)local_98);
  local_50 = (WindowCollection *)0x0;
  __ptr_01 = (WindowCollection *)
             (((shared_ptr<duckdb::BlockHandle,_true> *)local_d8._56_8_)->internal).
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (((shared_ptr<duckdb::BlockHandle,_true> *)local_d8._56_8_)->internal).
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_01;
  if (__ptr_01 != (WindowCollection *)0x0) {
    ::std::default_delete<duckdb::WindowCollection>::operator()
              ((default_delete<duckdb::WindowCollection> *)local_d8._56_8_,__ptr_01);
  }
  if (local_50 != (WindowCollection *)0x0) {
    ::std::default_delete<duckdb::WindowCollection>::operator()
              ((default_delete<duckdb::WindowCollection> *)&local_50,local_50);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_98);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  return;
}

Assistant:

WindowHashGroup::WindowHashGroup(WindowGlobalSinkState &gstate, const idx_t hash_bin_p)
    : count(0), blocks(0), stage(WindowGroupStage::SINK), hash_bin(hash_bin_p), sunk(0), finalized(0), completed(0),
      batch_base(0) {
	// There are three types of partitions:
	// 1. No partition (no sorting)
	// 2. One partition (sorting, but no hashing)
	// 3. Multiple partitions (sorting and hashing)

	//	How big is the partition?
	auto &gpart = *gstate.global_partition;
	layout.Initialize(gpart.payload_types);
	if (hash_bin < gpart.hash_groups.size() && gpart.hash_groups[hash_bin]) {
		count = gpart.hash_groups[hash_bin]->count;
	} else if (gpart.rows && !hash_bin) {
		count = gpart.count;
	} else {
		return;
	}

	//	Initialise masks to false
	partition_mask.Initialize(count);
	partition_mask.SetAllInvalid(count);

	const auto &executors = gstate.executors;
	for (auto &wexec : executors) {
		auto &wexpr = wexec->wexpr;
		auto &order_mask = order_masks[wexpr.partitions.size() + wexpr.orders.size()];
		if (order_mask.IsMaskSet()) {
			continue;
		}
		order_mask.Initialize(count);
		order_mask.SetAllInvalid(count);
	}

	// Scan the sorted data into new Collections
	external = gpart.external;
	if (gpart.rows && !hash_bin) {
		// Simple mask
		partition_mask.SetValidUnsafe(0);
		for (auto &order_mask : order_masks) {
			order_mask.second.SetValidUnsafe(0);
		}
		//	No partition - align the heap blocks with the row blocks
		rows = gpart.rows->CloneEmpty(gpart.rows->keep_pinned);
		heap = gpart.strings->CloneEmpty(gpart.strings->keep_pinned);
		RowDataCollectionScanner::AlignHeapBlocks(*rows, *heap, *gpart.rows, *gpart.strings, layout);
		external = true;
	} else if (hash_bin < gpart.hash_groups.size()) {
		// Overwrite the collections with the sorted data
		D_ASSERT(gpart.hash_groups[hash_bin].get());
		hash_group = std::move(gpart.hash_groups[hash_bin]);
		hash_group->ComputeMasks(partition_mask, order_masks);
		external = hash_group->global_sort->external;
		MaterializeSortedData();
	}

	if (rows) {
		blocks = rows->blocks.size();
	}

	// Set up the collection for any fully materialised data
	const auto &shared = WindowSharedExpressions::GetSortedExpressions(gstate.shared.coll_shared);
	vector<LogicalType> types;
	for (auto &expr : shared) {
		types.emplace_back(expr->return_type);
	}
	auto &buffer_manager = BufferManager::GetBufferManager(gstate.context);
	collection = make_uniq<WindowCollection>(buffer_manager, count, types);
}